

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void TestSymlink(void)

{
  ostream *poVar1;
  string sym;
  string dest;
  string *in_stack_000003e8;
  string *in_stack_000003f0;
  char *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  int severity;
  char *in_stack_fffffffffffffef8;
  LogMessage *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  allocator<char> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  allocator<char> local_c1;
  string local_c0 [32];
  LogMessageData *in_stack_ffffffffffffff60;
  string local_90 [32];
  string local_70 [48];
  string local_40 [32];
  string local_20 [32];
  
  severity = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  fprintf(_stderr,"==== Test setting log file symlink\n");
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  DeleteFiles((string *)in_stack_ffffffffffffff60);
  std::__cxx11::string::~string(local_70);
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  DeleteFiles((string *)in_stack_ffffffffffffff60);
  std::__cxx11::string::~string(local_90);
  google::SetLogSymlink(severity,in_stack_fffffffffffffee8);
  std::__cxx11::string::c_str();
  google::SetLogDestination(severity,in_stack_fffffffffffffee8);
  google::LogMessage::LogMessage(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,severity);
  poVar1 = google::LogMessage::stream((LogMessage *)&stack0xffffffffffffff60);
  std::operator<<(poVar1,"message to new symlink");
  google::LogMessage::~LogMessage(in_stack_ffffffffffffff00);
  google::FlushLogFiles(0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  CheckFile(in_stack_000003f0,in_stack_000003e8);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  DeleteFiles((string *)in_stack_ffffffffffffff60);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  DeleteFiles((string *)in_stack_ffffffffffffff60);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_20);
  return;
}

Assistant:

static void TestSymlink() {
#ifndef OS_WINDOWS
  fprintf(stderr, "==== Test setting log file symlink\n");
  string dest = FLAGS_test_tmpdir + "/logging_test_symlink";
  string sym = FLAGS_test_tmpdir + "/symlinkbase";
  DeleteFiles(dest + "*");
  DeleteFiles(sym + "*");

  SetLogSymlink(GLOG_INFO, "symlinkbase");
  SetLogDestination(GLOG_INFO, dest.c_str());
  LOG(INFO) << "message to new symlink";
  FlushLogFiles(GLOG_INFO);
  CheckFile(sym, "message to new symlink");

  DeleteFiles(dest + "*");
  DeleteFiles(sym + "*");
#endif
}